

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

Element __thiscall ftxui::focus(ftxui *this,Element *child)

{
  shared_ptr<ftxui::Node> *args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar1;
  shared_ptr<ftxui::Node> local_50;
  Elements local_40;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_28;
  Element *child_local;
  
  local_28.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = child;
  child_local = (Element *)this;
  std::shared_ptr<ftxui::Node>::shared_ptr(&local_50,child);
  unpack<std::shared_ptr<ftxui::Node>>(&local_40,(ftxui *)&local_50,args);
  std::
  make_shared<ftxui::Focus,std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>>
            (&local_28);
  std::shared_ptr<ftxui::Node>::shared_ptr<ftxui::Focus,void>
            ((shared_ptr<ftxui::Node> *)this,(shared_ptr<ftxui::Focus> *)&local_28);
  std::shared_ptr<ftxui::Focus>::~shared_ptr((shared_ptr<ftxui::Focus> *)&local_28);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_40);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_50);
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element focus(Element child) {
  return std::make_shared<Focus>(unpack(std::move(child)));
}